

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O0

REF_STATUS ref_acceptance_pd(REF_NODE ref_node,char *function_name,REF_INT *ldim,REF_DBL **scalar)

{
  int iVar1;
  uint uVar2;
  REF_DBL *pRVar3;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_DBL dual_3 [5];
  REF_DBL local_188;
  REF_DBL primitive_3 [5];
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_DBL dual_2 [5];
  REF_DBL local_128;
  REF_DBL primitive_2 [5];
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_DBL dual_1 [5];
  REF_DBL local_c8;
  REF_DBL primitive_1 [5];
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dual [5];
  REF_DBL local_68;
  REF_DBL primitive [5];
  int local_38;
  int local_34;
  REF_INT i;
  REF_INT node;
  REF_DBL **scalar_local;
  REF_INT *ldim_local;
  char *function_name_local;
  REF_NODE ref_node_local;
  
  *ldim = 10;
  if (*ldim * ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0x1e5,"ref_acceptance_pd","malloc *scalar of REF_DBL negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    pRVar3 = (REF_DBL *)malloc((long)(*ldim * ref_node->max) << 3);
    *scalar = pRVar3;
    if (*scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
             0x1e5,"ref_acceptance_pd","malloc *scalar of REF_DBL NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      for (local_34 = 0; local_34 < ref_node->max; local_34 = local_34 + 1) {
        if (((-1 < local_34) && (local_34 < ref_node->max)) && (-1 < ref_node->global[local_34])) {
          iVar1 = strcmp(function_name,"trig");
          if (iVar1 == 0) {
            primitive_1[4]._4_4_ =
                 ref_acceptance_primal_trig
                           (ref_node->real[local_34 * 0xf],ref_node->real[local_34 * 0xf + 1],
                            &local_68);
            if (primitive_1[4]._4_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                     ,0x1ed,"ref_acceptance_pd",(ulong)primitive_1[4]._4_4_,"trig");
              return primitive_1[4]._4_4_;
            }
            primitive_1[4]._0_4_ =
                 ref_phys_entropy_adjoint(&local_68,(REF_DBL *)&ref_private_macro_code_rss_1);
            if (primitive_1[4]._0_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                     ,0x1ee,"ref_acceptance_pd",(ulong)primitive_1[4]._0_4_,"entropy adj");
              return primitive_1[4]._0_4_;
            }
            for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
              (*scalar)[local_38 + *ldim * local_34] = primitive[(long)local_38 + -1];
            }
            for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
              (*scalar)[local_38 + 5 + *ldim * local_34] =
                   *(REF_DBL *)(&ref_private_macro_code_rss_1 + (long)local_38 * 2);
            }
            primitive_1[4]._0_4_ = 0;
          }
          else {
            iVar1 = strcmp(function_name,"vortex");
            if (iVar1 == 0) {
              primitive_2[4]._4_4_ =
                   ref_acceptance_primal_vortex
                             (ref_node->real[local_34 * 0xf],ref_node->real[local_34 * 0xf + 1],
                              &local_c8);
              if (primitive_2[4]._4_4_ != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                       ,0x1f6,"ref_acceptance_pd",(ulong)primitive_2[4]._4_4_,"vortex");
                return primitive_2[4]._4_4_;
              }
              primitive_2[4]._0_4_ =
                   ref_phys_entropy_adjoint(&local_c8,(REF_DBL *)&ref_private_macro_code_rss_3);
              if (primitive_2[4]._0_4_ != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                       ,0x1f7,"ref_acceptance_pd",(ulong)primitive_2[4]._0_4_,"entropy adj");
                return primitive_2[4]._0_4_;
              }
              for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
                (*scalar)[local_38 + *ldim * local_34] = primitive_1[(long)local_38 + -1];
              }
              for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
                (*scalar)[local_38 + 5 + *ldim * local_34] =
                     *(REF_DBL *)(&ref_private_macro_code_rss_3 + (long)local_38 * 2);
              }
              primitive_2[4]._0_4_ = 0;
            }
            else {
              iVar1 = strcmp(function_name,"coax");
              if (iVar1 == 0) {
                primitive_3[4]._4_4_ =
                     ref_acceptance_primal_coax
                               (ref_node->real[local_34 * 0xf],ref_node->real[local_34 * 0xf + 1],
                                &local_128);
                if (primitive_3[4]._4_4_ != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                         ,0x1ff,"ref_acceptance_pd",(ulong)primitive_3[4]._4_4_,"coax");
                  return primitive_3[4]._4_4_;
                }
                primitive_3[4]._0_4_ =
                     ref_phys_entropy_adjoint(&local_128,(REF_DBL *)&ref_private_macro_code_rss_5);
                if (primitive_3[4]._0_4_ != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                         ,0x200,"ref_acceptance_pd",(ulong)primitive_3[4]._0_4_,"entropy adj");
                  return primitive_3[4]._0_4_;
                }
                for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
                  (*scalar)[local_38 + *ldim * local_34] = primitive_2[(long)local_38 + -1];
                }
                for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
                  (*scalar)[local_38 + 5 + *ldim * local_34] =
                       *(REF_DBL *)(&ref_private_macro_code_rss_5 + (long)local_38 * 2);
                }
                primitive_3[4]._0_4_ = 0;
              }
              else {
                iVar1 = strcmp(function_name,"ringleb");
                if (iVar1 != 0) {
                  printf("%s: %d: %s %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                         ,0x20d,"unknown user function",function_name);
                  return 5;
                }
                uVar2 = ref_acceptance_primal_ringleb
                                  (ref_node->real[local_34 * 0xf],ref_node->real[local_34 * 0xf + 1]
                                   ,&local_188);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                         ,0x208,"ref_acceptance_pd",(ulong)uVar2,"ringleb");
                  return uVar2;
                }
                uVar2 = ref_phys_entropy_adjoint
                                  (&local_188,(REF_DBL *)&ref_private_macro_code_rss_7);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                         ,0x209,"ref_acceptance_pd",(ulong)uVar2,"entropy adj");
                  return uVar2;
                }
                for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
                  (*scalar)[local_38 + *ldim * local_34] = primitive_3[(long)local_38 + -1];
                }
                for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
                  (*scalar)[local_38 + 5 + *ldim * local_34] =
                       *(REF_DBL *)(&ref_private_macro_code_rss_7 + (long)local_38 * 2);
                }
              }
            }
          }
        }
      }
      ref_node_local._4_4_ = 0;
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_pd(REF_NODE ref_node,
                                            const char *function_name,
                                            REF_INT *ldim, REF_DBL **scalar) {
  REF_INT node, i;
  *ldim = 10;
  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(function_name, "trig") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "trig");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "vortex") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_vortex(ref_node_xyz(ref_node, 0, node),
                                       ref_node_xyz(ref_node, 1, node),
                                       primitive),
          "vortex");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "coax") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_coax(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else if (strcmp(function_name, "ringleb") == 0) {
      REF_DBL primitive[5], dual[5];
      RSS(ref_acceptance_primal_ringleb(ref_node_xyz(ref_node, 0, node),
                                        ref_node_xyz(ref_node, 1, node),
                                        primitive),
          "ringleb");
      RSS(ref_phys_entropy_adjoint(primitive, dual), "entropy adj");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
      for (i = 0; i < 5; i++) (*scalar)[i + 5 + (*ldim) * node] = dual[i];
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}